

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O3

void GetDefault(void)

{
  char *pcVar1;
  char *pcVar2;
  
  if (Current != (tchar_t *)0x0) {
    return;
  }
  setlocale(6,"");
  pcVar1 = setlocale(0,"");
  pcVar2 = "";
  if (pcVar1 != (char *)0x0) {
    pcVar1 = strrchr(pcVar1,0x2e);
    pcVar2 = "";
    if (pcVar1 != (char *)0x0) {
      pcVar2 = pcVar1 + 1;
    }
  }
  Current = pcVar2;
  return;
}

Assistant:

static NOINLINE void GetDefault(void)
{
    if (!Current)
    {
        setlocale(LC_ALL,""); // set default for all
        Current = setlocale(LC_CTYPE,"");
        if (Current)
            Current = strrchr(Current,'.');
        if (Current)
           ++Current;
        else
           Current = "";
    }
}